

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detector.cpp
# Opt level: O3

void __thiscall Semantic::Detector::handleErrors(Detector *this,NamePair *_errors,bool isOverloaded)

{
  long *plVar1;
  long *plVar2;
  pointer __rhs;
  char *pcVar3;
  string warningString;
  char *__end;
  long *local_c0;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  value_type local_80;
  char *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs = (_errors->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (_errors->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != local_58) {
    pcVar3 = "Duplicate";
    if (isOverloaded) {
      pcVar3 = "Overloaded";
    }
    local_60 = pcVar3 + (ulong)isOverloaded + 9;
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,pcVar3,local_60);
      std::operator+(&local_50," class function ",&__rhs->first);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_90 = *plVar2;
        lStack_88 = plVar1[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar2;
        local_a0 = (long *)*plVar1;
      }
      local_98 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a0,(ulong)(__rhs->second)._M_dataplus._M_p);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_b0 = *plVar2;
        lStack_a8 = plVar1[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar2;
        local_c0 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_c0);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->warnings,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != local_58);
  }
  return;
}

Assistant:

void Semantic::Detector::handleErrors(NamePair &_errors, bool isOverloaded) {
    for (const auto &e : _errors) {
        std::string warningString = isOverloaded ? "Overloaded" : "Duplicate";
        warningString += " class function " + e.first + " on class " + e.second;
        addWarning(warningString);
    }
}